

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

uint __thiscall llvm::StringMapImpl::RehashTable(StringMapImpl *this,uint BucketNo)

{
  uint uVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  StringMapEntryBase **ppSVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint local_34;
  
  ppSVar3 = this->TheTable;
  uVar11 = this->NumBuckets;
  uVar12 = (ulong)uVar11;
  if (uVar11 * 3 < this->NumItems * 4) {
    uVar11 = uVar11 * 2;
    uVar7 = (ulong)uVar11;
  }
  else {
    uVar7 = uVar12;
    if (uVar11 >> 3 < uVar11 - (this->NumItems + this->NumTombstones)) {
      return BucketNo;
    }
  }
  ppSVar5 = (StringMapEntryBase **)safe_calloc((ulong)(uVar11 + 1),0xc);
  ppSVar5[uVar7] = (StringMapEntryBase *)0x2;
  uVar1 = this->NumBuckets;
  local_34 = BucketNo;
  if ((ulong)uVar1 != 0) {
    uVar8 = 0;
    do {
      pSVar4 = this->TheTable[uVar8];
      if ((pSVar4 != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (pSVar4 != (StringMapEntryBase *)0x0)) {
        uVar2 = *(uint *)((long)ppSVar3 + uVar8 * 4 + uVar12 * 8 + 8);
        uVar10 = (ulong)(uVar2 & uVar11 - 1);
        if (ppSVar5[uVar10] != (StringMapEntryBase *)0x0) {
          iVar6 = 1;
          do {
            uVar9 = (int)uVar10 + iVar6;
            iVar6 = iVar6 + 1;
            uVar10 = (ulong)(uVar9 & uVar11 - 1);
          } while (ppSVar5[uVar10] != (StringMapEntryBase *)0x0);
        }
        ppSVar5[uVar10] = pSVar4;
        *(uint *)((long)ppSVar5 + uVar10 * 4 + uVar7 * 8 + 8) = uVar2;
        if (uVar8 == BucketNo) {
          local_34 = (uint)uVar10;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  free(this->TheTable);
  this->TheTable = ppSVar5;
  this->NumBuckets = uVar11;
  this->NumTombstones = 0;
  return local_34;
}

Assistant:

unsigned StringMapImpl::RehashTable(unsigned BucketNo) {
  unsigned NewSize;
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  // If the hash table is now more than 3/4 full, or if fewer than 1/8 of
  // the buckets are empty (meaning that many are filled with tombstones),
  // grow/rehash the table.
  if (LLVM_UNLIKELY(NumItems * 4 > NumBuckets * 3)) {
    NewSize = NumBuckets*2;
  } else if (LLVM_UNLIKELY(NumBuckets - (NumItems + NumTombstones) <=
                           NumBuckets / 8)) {
    NewSize = NumBuckets;
  } else {
    return BucketNo;
  }

  unsigned NewBucketNo = BucketNo;
  // Allocate one extra bucket which will always be non-empty.  This allows the
  // iterators to stop at end.
  auto NewTableArray = static_cast<StringMapEntryBase **>(
      safe_calloc(NewSize+1, sizeof(StringMapEntryBase *) + sizeof(unsigned)));

  unsigned *NewHashArray = (unsigned *)(NewTableArray + NewSize + 1);
  NewTableArray[NewSize] = (StringMapEntryBase*)2;

  // Rehash all the items into their new buckets.  Luckily :) we already have
  // the hash values available, so we don't have to rehash any strings.
  for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
    StringMapEntryBase *Bucket = TheTable[I];
    if (Bucket && Bucket != getTombstoneVal()) {
      // Fast case, bucket available.
      unsigned FullHash = HashTable[I];
      unsigned NewBucket = FullHash & (NewSize-1);
      if (!NewTableArray[NewBucket]) {
        NewTableArray[FullHash & (NewSize-1)] = Bucket;
        NewHashArray[FullHash & (NewSize-1)] = FullHash;
        if (I == BucketNo)
          NewBucketNo = NewBucket;
        continue;
      }

      // Otherwise probe for a spot.
      unsigned ProbeSize = 1;
      do {
        NewBucket = (NewBucket + ProbeSize++) & (NewSize-1);
      } while (NewTableArray[NewBucket]);

      // Finally found a slot.  Fill it in.
      NewTableArray[NewBucket] = Bucket;
      NewHashArray[NewBucket] = FullHash;
      if (I == BucketNo)
        NewBucketNo = NewBucket;
    }
  }

  free(TheTable);

  TheTable = NewTableArray;
  NumBuckets = NewSize;
  NumTombstones = 0;
  return NewBucketNo;
}